

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

void hor_boundary_overlap
               (int *top_block,int top_stride,int *bottom_block,int bottom_stride,int *dst_block,
               int dst_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = grain_max;
  iVar1 = grain_min;
  if (height == 1) {
    if (width != 0) {
      lVar3 = 0;
      do {
        iVar4 = top_block[lVar3] * 0x17 + bottom_block[lVar3] * 0x16 + 0x10 >> 5;
        iVar5 = iVar2;
        if (iVar4 < iVar2) {
          iVar5 = iVar4;
        }
        if (iVar4 < iVar1) {
          iVar5 = iVar1;
        }
        dst_block[lVar3] = iVar5;
        lVar3 = lVar3 + 1;
      } while (width != (int)lVar3);
    }
  }
  else if (width != 0) {
    do {
      iVar4 = *top_block * 0x1b + *bottom_block * 0x11 + 0x10 >> 5;
      iVar5 = iVar2;
      if (iVar4 < iVar2) {
        iVar5 = iVar4;
      }
      if (iVar4 < iVar1) {
        iVar5 = iVar1;
      }
      *dst_block = iVar5;
      iVar4 = bottom_block[(uint)bottom_stride] * 0x1b + top_block[top_stride] * 0x11 + 0x10 >> 5;
      iVar5 = iVar2;
      if (iVar4 < iVar2) {
        iVar5 = iVar4;
      }
      if (iVar4 < iVar1) {
        iVar5 = iVar1;
      }
      dst_block[dst_stride] = iVar5;
      top_block = top_block + 1;
      bottom_block = bottom_block + 1;
      dst_block = dst_block + 1;
      width = width + -1;
    } while (width != 0);
  }
  return;
}

Assistant:

static void hor_boundary_overlap(int *top_block, int top_stride,
                                 int *bottom_block, int bottom_stride,
                                 int *dst_block, int dst_stride, int width,
                                 int height) {
  if (height == 1) {
    while (width) {
      *dst_block = clamp((*top_block * 23 + *bottom_block * 22 + 16) >> 5,
                         grain_min, grain_max);
      ++top_block;
      ++bottom_block;
      ++dst_block;
      --width;
    }
    return;
  } else if (height == 2) {
    while (width) {
      dst_block[0] = clamp((27 * top_block[0] + 17 * bottom_block[0] + 16) >> 5,
                           grain_min, grain_max);
      dst_block[dst_stride] = clamp((17 * top_block[top_stride] +
                                     27 * bottom_block[bottom_stride] + 16) >>
                                        5,
                                    grain_min, grain_max);
      ++top_block;
      ++bottom_block;
      ++dst_block;
      --width;
    }
    return;
  }
}